

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void __thiscall SSTable::fillData(SSTable *this,SSTableData *new_data)

{
  pointer pSVar1;
  pointer pSVar2;
  longlong lVar3;
  longlong lVar4;
  SSTableData *pSVar5;
  SSTableIndex *pSVar6;
  SSTableHeader *pSVar7;
  iterator __end1;
  iterator __begin1;
  pointer pSVar8;
  size_t sVar9;
  SSTableIndexItem local_40;
  
  pSVar5 = (SSTableData *)operator_new(0x18);
  pSVar1 = (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  (pSVar5->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = pSVar1;
  pSVar2 = (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (pSVar5->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = pSVar2;
  (pSVar5->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (new_data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->data = pSVar5;
  lVar3 = pSVar1->key;
  lVar4 = pSVar2[-1].key;
  pSVar6 = (SSTableIndex *)operator_new(0x18);
  (pSVar6->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar6->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar6->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->index = pSVar6;
  sVar9 = 0x20;
  for (pSVar8 = pSVar1; pSVar8 != pSVar2; pSVar8 = pSVar8 + 1) {
    local_40.key = pSVar8->key;
    local_40.offset = sVar9;
    std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::emplace_back<SSTableIndexItem>
              (this->index,&local_40);
    sVar9 = sVar9 + (pSVar8->value)._M_string_length + 0x19;
  }
  pSVar7 = (SSTableHeader *)operator_new(0x20);
  pSVar7->index_offset = sVar9;
  pSVar7->entries_count = (long)pSVar2 - (long)pSVar1 >> 6;
  pSVar7->key_min = lVar3;
  pSVar7->key_max = lVar4;
  this->header = pSVar7;
  return;
}

Assistant:

void SSTable::fillData(SSTableData &&new_data) {
    data = new SSTableData{std::move(new_data)};
    long long key_min = 0, key_max = 0;
    size_t file_offset = 0, entries_count = data->size();
    // Determining header.
    key_min = data->begin()->key;
    key_max = data->rbegin()->key;
    file_offset = 32; // Header use 32 bytes.
    size_t item_bytes = 0;
    index = new SSTableIndex{};
    for (const auto &item:*data) {
        index->push_back({item.key, file_offset});
        item_bytes = size_of_entry(item);
        file_offset += item_bytes;
    }
    header = new SSTableHeader{file_offset, entries_count, key_min, key_max};
}